

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QAbstractItemModelPrivate::Change>::reallocateAndGrow
          (QArrayDataPointer<QAbstractItemModelPrivate::Change> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QAbstractItemModelPrivate::Change> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  Change *pCVar3;
  undefined1 *puVar4;
  bool bVar5;
  quintptr qVar6;
  undefined7 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Change *pCVar12;
  long lVar13;
  long lVar14;
  Change *pCVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0 && where == GrowsAtEnd) {
    pDVar1 = this->d;
    if (pDVar1 == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pDVar1 == (Data *)0x0) {
        lVar14 = 0;
        lVar13 = 0;
      }
      else {
        lVar14 = (pDVar1->super_QArrayData).alloc;
        lVar13 = (this->size - (pDVar1->super_QArrayData).alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x3333333333333333;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::reallocate
                  ((QMovableArrayOps<QAbstractItemModelPrivate::Change> *)this,lVar14 + n + lVar13,
                   Grow);
        return;
      }
      goto LAB_00467a76;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (Change *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (Change *)0x0)) {
    if (this->size != 0) {
      lVar14 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pCVar12 = this->ptr;
      pCVar3 = pCVar12 + lVar14;
      if ((old != (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0) || (bVar5)) {
        if ((lVar14 != 0) && (0 < lVar14)) {
          pCVar15 = local_38.ptr + local_38.size;
          do {
            uVar7 = *(undefined7 *)&pCVar12->field_0x21;
            pCVar15->needsAdjust = pCVar12->needsAdjust;
            *(undefined7 *)&pCVar15->field_0x21 = uVar7;
            iVar10 = (pCVar12->parent).r;
            iVar11 = (pCVar12->parent).c;
            qVar6 = (pCVar12->parent).i;
            iVar8 = pCVar12->first;
            iVar9 = pCVar12->last;
            (pCVar15->parent).m.ptr = (pCVar12->parent).m.ptr;
            pCVar15->first = iVar8;
            pCVar15->last = iVar9;
            (pCVar15->parent).r = iVar10;
            (pCVar15->parent).c = iVar11;
            (pCVar15->parent).i = qVar6;
            pCVar12 = pCVar12 + 1;
            local_38.size = local_38.size + 1;
            pCVar15 = pCVar15 + 1;
          } while (pCVar12 < pCVar3);
        }
      }
      else if ((lVar14 != 0) && (0 < lVar14)) {
        pCVar15 = local_38.ptr + local_38.size;
        do {
          uVar7 = *(undefined7 *)&pCVar12->field_0x21;
          pCVar15->needsAdjust = pCVar12->needsAdjust;
          *(undefined7 *)&pCVar15->field_0x21 = uVar7;
          iVar10 = (pCVar12->parent).r;
          iVar11 = (pCVar12->parent).c;
          qVar6 = (pCVar12->parent).i;
          iVar8 = pCVar12->first;
          iVar9 = pCVar12->last;
          (pCVar15->parent).m.ptr = (pCVar12->parent).m.ptr;
          pCVar15->first = iVar8;
          pCVar15->last = iVar9;
          (pCVar15->parent).r = iVar10;
          (pCVar15->parent).c = iVar11;
          (pCVar15->parent).i = qVar6;
          pCVar12 = pCVar12 + 1;
          local_38.size = local_38.size + 1;
          pCVar15 = pCVar15 + 1;
        } while (pCVar12 < pCVar3);
      }
    }
    pQVar2 = &this->d->super_QArrayData;
    pCVar3 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar4 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar2;
    local_38.ptr = pCVar3;
    local_38.size = (qsizetype)puVar4;
    if (old != (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = (Data *)pQVar2;
      old->ptr = pCVar3;
      local_38.size = old->size;
      old->size = (qsizetype)puVar4;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x28,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_00467a76:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }